

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FIWADInfo,_FIWADInfo>::Reserve(TArray<FIWADInfo,_FIWADInfo> *this,uint amount)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar3 = (ulong)uVar1;
  uVar2 = amount + uVar1;
  this->Count = uVar2;
  lVar4 = uVar3 * 0x60;
  for (; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    FIWADInfo::FIWADInfo((FIWADInfo *)((long)&(this->Array->Name).Chars + lVar4));
    uVar2 = this->Count;
    lVar4 = lVar4 + 0x60;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}